

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_linux.c
# Opt level: O0

ATimeUs aAppTime(void)

{
  undefined1 local_18 [8];
  timespec ts;
  
  clock_gettime(1,(timespec *)local_18);
  if ((a__time_start.tv_sec == 0) && (a__time_start.tv_nsec == 0)) {
    a__time_start.tv_sec = (__time_t)local_18;
    a__time_start.tv_nsec = ts.tv_sec;
  }
  return (local_18._0_4_ - (int)a__time_start.tv_sec) * 1000000 +
         (int)((ts.tv_sec - a__time_start.tv_nsec) / 1000);
}

Assistant:

ATimeUs aAppTime(void) {
	struct timespec ts;
	clock_gettime(CLOCK_MONOTONIC, &ts);
	if (a__time_start.tv_sec == 0 && a__time_start.tv_nsec == 0)
		a__time_start = ts;
	return //
		(ts.tv_sec - a__time_start.tv_sec) * 1000000 + //
		(ts.tv_nsec - a__time_start.tv_nsec) / 1000;
}